

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O1

void Abc_NtkBalanceLevel(Abc_Ntk_t *pNtk)

{
  uint *puVar1;
  long lVar2;
  Vec_Ptr_t *pVVar3;
  
  pVVar3 = pNtk->vObjs;
  if (0 < pVVar3->nSize) {
    lVar2 = 0;
    do {
      if (pVVar3->pArray[lVar2] != (void *)0x0) {
        puVar1 = (uint *)((long)pVVar3->pArray[lVar2] + 0x14);
        *puVar1 = *puVar1 & 0xfff;
      }
      lVar2 = lVar2 + 1;
      pVVar3 = pNtk->vObjs;
    } while (lVar2 < pVVar3->nSize);
  }
  pVVar3 = pNtk->vCos;
  if (0 < pVVar3->nSize) {
    lVar2 = 0;
    do {
      Abc_NtkBalanceLevel_rec
                (*(Abc_Obj_t **)
                  (*(long *)(*(long *)(*pVVar3->pArray[lVar2] + 0x20) + 8) +
                  (long)**(int **)((long)pVVar3->pArray[lVar2] + 0x20) * 8));
      lVar2 = lVar2 + 1;
      pVVar3 = pNtk->vCos;
    } while (lVar2 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Abc_NtkBalanceLevel( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i;
    Abc_NtkForEachObj( pNtk, pNode, i )
        pNode->Level = 0;
    Abc_NtkForEachCo( pNtk, pNode, i )
        Abc_NtkBalanceLevel_rec( Abc_ObjFanin0(pNode) );
}